

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall google::LogMessage::SendToLog(LogMessage *this)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  LogMessageData *pLVar6;
  ulong uVar7;
  time_t tVar8;
  char *pcVar9;
  char *pcVar10;
  long *plVar11;
  LogMessage *pLVar12;
  bool bVar13;
  int iVar14;
  LogDestination *this_00;
  int i;
  long lVar15;
  uint severity;
  ulong uVar16;
  ReaderMutexLock local_40;
  LogMessage *local_38;
  
  sVar5 = this->data_->num_chars_to_log_;
  if ((sVar5 == 0) || (this->data_->message_text_[sVar5 - 1] != '\n')) {
    RawLog__(3,"/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
             ,0x5a0,"Check %s failed: %s",
             "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_-1] == \'\\n\'"
             ,"");
  }
  if ((SendToLog()::already_warned_before_initgoogle == '\0') &&
     (bVar13 = glog_internal_namespace_::IsGoogleLoggingInitialized(), !bVar13)) {
    SendToLog();
  }
  local_38 = this;
  if ((fLB::FLAGS_logtostderr == '\0') &&
     (bVar13 = glog_internal_namespace_::IsGoogleLoggingInitialized(), bVar13)) {
    pLVar6 = this->data_;
    bVar2 = pLVar6->severity_;
    severity = (uint)(char)bVar2;
    uVar7 = pLVar6->num_chars_to_log_;
    if (fLB::FLAGS_logtostderr == '\0') {
      if (-1 < (char)bVar2) {
        if (3 < bVar2) {
          __assert_fail("severity >=0 && severity < NUM_SEVERITIES",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                        ,0x32d,
                        "static LogDestination *google::LogDestination::log_destination(LogSeverity)"
                       );
        }
        tVar8 = pLVar6->timestamp_;
        uVar16 = (ulong)severity;
        lVar15 = 0;
        do {
          iVar4 = fLI::FLAGS_logbuflevel;
          if ((&LogDestination::log_destinations_)[uVar16 + lVar15] == 0) {
            this_00 = (LogDestination *)operator_new(0xe0);
            LogDestination::LogDestination(this_00,severity + (int)lVar15,(char *)0x0);
            (&LogDestination::log_destinations_)[uVar16 + lVar15] = this_00;
          }
          plVar11 = *(long **)((&LogDestination::log_destinations_)[uVar16 + lVar15] + 0xd8);
          (**(code **)(*plVar11 + 0x10))
                    (plVar11,iVar4 < (int)((int)lVar15 + severity),tVar8,pLVar6->message_text_,
                     uVar7 & 0xffffffff);
          lVar1 = lVar15 + uVar16;
          lVar15 = lVar15 + -1;
        } while (lVar1 != 0);
      }
    }
    else {
      ColoredWriteToStderr(severity,pLVar6->message_text_,uVar7);
    }
    pLVar12 = local_38;
    pLVar6 = local_38->data_;
    if ((fLI::FLAGS_stderrthreshold <= pLVar6->severity_) || (fLB::FLAGS_alsologtostderr == '\x01'))
    {
      ColoredWriteToStderr((int)pLVar6->severity_,pLVar6->message_text_,pLVar6->num_chars_to_log_);
    }
    pLVar6 = pLVar12->data_;
    LogDestination::MaybeLogToEmail
              ((int)pLVar6->severity_,pLVar6->message_text_,pLVar6->num_chars_to_log_);
    pLVar6 = pLVar12->data_;
    cVar3 = pLVar6->severity_;
    pcVar9 = pLVar6->fullname_;
    pcVar10 = pLVar6->basename_;
    iVar4 = pLVar6->line_;
    uVar7 = pLVar6->num_prefix_chars_;
    sVar5 = pLVar6->num_chars_to_log_;
    local_40.mu_ = (Mutex *)LogDestination::sink_mutex_;
    if ((LogDestination::sink_mutex_[0x38] == '\x01') &&
       (iVar14 = pthread_rwlock_rdlock((pthread_rwlock_t *)LogDestination::sink_mutex_), iVar14 != 0
       )) {
      abort();
    }
    if (LogDestination::sinks_ != (long *)0x0) {
      uVar16 = (ulong)(LogDestination::sinks_[1] - *LogDestination::sinks_) >> 3;
      while( true ) {
        uVar16 = uVar16 - 1;
        if ((int)(uint)uVar16 < 0) break;
        plVar11 = *(long **)(*LogDestination::sinks_ + (ulong)((uint)uVar16 & 0x7fffffff) * 8);
        (**(code **)(*plVar11 + 0x10))
                  (plVar11,(int)cVar3,pcVar9,pcVar10,iVar4,&pLVar6->tm_time_,
                   pLVar6->message_text_ + uVar7,~uVar7 + sVar5);
      }
    }
  }
  else {
    pLVar6 = this->data_;
    ColoredWriteToStderr((int)pLVar6->severity_,pLVar6->message_text_,pLVar6->num_chars_to_log_);
    pLVar6 = this->data_;
    cVar3 = pLVar6->severity_;
    pcVar9 = pLVar6->fullname_;
    pcVar10 = pLVar6->basename_;
    iVar4 = pLVar6->line_;
    uVar7 = pLVar6->num_prefix_chars_;
    sVar5 = pLVar6->num_chars_to_log_;
    local_40.mu_ = (Mutex *)LogDestination::sink_mutex_;
    if ((LogDestination::sink_mutex_[0x38] == '\x01') &&
       (iVar14 = pthread_rwlock_rdlock((pthread_rwlock_t *)LogDestination::sink_mutex_), iVar14 != 0
       )) goto LAB_00111ffa;
    if (LogDestination::sinks_ != (long *)0x0) {
      uVar16 = (ulong)(LogDestination::sinks_[1] - *LogDestination::sinks_) >> 3;
      while( true ) {
        uVar16 = uVar16 - 1;
        if ((int)(uint)uVar16 < 0) break;
        plVar11 = *(long **)(*LogDestination::sinks_ + (ulong)((uint)uVar16 & 0x7fffffff) * 8);
        (**(code **)(*plVar11 + 0x10))
                  (plVar11,(int)cVar3,pcVar9,pcVar10,iVar4,&pLVar6->tm_time_,
                   pLVar6->message_text_ + uVar7,~uVar7 + sVar5);
      }
    }
  }
  ::glog_internal_namespace_::ReaderMutexLock::~ReaderMutexLock(&local_40);
  pLVar12 = local_38;
  if ((local_38->data_->severity_ != '\x03') || (exit_on_dfatal != '\x01')) {
    return;
  }
  if (local_38->data_->first_fatal_ == true) {
    crash_reason._0_8_ = fatal_msg_data_exclusive._30488_8_;
    crash_reason._8_4_ = fatal_msg_data_exclusive._30364_4_;
    crash_reason._16_8_ = fatal_msg_data_exclusive._30456_8_ + 0x133b94;
    crash_reason._280_4_ = GetStackTrace((void **)(crash_reason + 0x18),0x20,4);
    glog_internal_namespace_::SetCrashReason((CrashReason *)crash_reason);
    iVar4 = (int)pLVar12->data_->num_chars_to_log_;
    iVar14 = 0xff;
    if (iVar4 < 0xff) {
      iVar14 = iVar4;
    }
    memcpy(&fatal_message,pLVar12->data_->message_text_,(long)iVar14);
    (&fatal_message)[iVar14] = 0;
    fatal_time = pLVar12->data_->timestamp_;
  }
  if (fLB::FLAGS_logtostderr == '\0') {
    lVar15 = 0;
    do {
      if ((&LogDestination::log_destinations_)[lVar15] != 0) {
        plVar11 = *(long **)((&LogDestination::log_destinations_)[lVar15] + 0xd8);
        (**(code **)(*plVar11 + 0x10))(plVar11,1,0,"",0);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
  }
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)log_mutex);
  LogDestination::WaitForSinks(pLVar12->data_);
  write(2,"*** Check failure stack trace: ***\n",0x23);
  (*(code *)g_logging_fail_func)();
LAB_00111ffa:
  abort();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  static bool already_warned_before_initgoogle = false;

  log_mutex.AssertHeld();

  RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
             data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");

  // Messages of a given severity get logged to lower severity logs, too

  if (!already_warned_before_initgoogle && !IsGoogleLoggingInitialized()) {
    const char w[] = "WARNING: Logging before InitGoogleLogging() is "
                     "written to STDERR\n";
    WriteToStderr(w, strlen(w));
    already_warned_before_initgoogle = true;
  }

  // global flag: never log to file if set.  Also -- don't log to a
  // file if we haven't parsed the command line flags to get the
  // program name.
  if (FLAGS_logtostderr || !IsGoogleLoggingInitialized()) {
    ColoredWriteToStderr(data_->severity_,
                         data_->message_text_, data_->num_chars_to_log_);

    // this could be protected by a flag if necessary.
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_ -
                                data_->num_prefix_chars_ - 1));
  } else {

    // log this message to all log files of severity <= severity_
    LogDestination::LogToAllLogfiles(data_->severity_, data_->timestamp_,
                                     data_->message_text_,
                                     data_->num_chars_to_log_);

    LogDestination::MaybeLogToStderr(data_->severity_, data_->message_text_,
                                     data_->num_chars_to_log_);
    LogDestination::MaybeLogToEmail(data_->severity_, data_->message_text_,
                                    data_->num_chars_to_log_);
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_
                                - data_->num_prefix_chars_ - 1));
    // NOTE: -1 removes trailing \n
  }

  // If we log a FATAL message, flush all the log destinations, then toss
  // a signal for others to catch. We leave the logs in a state that
  // someone else can use them (as long as they flush afterwards)
  if (data_->severity_ == GLOG_FATAL && exit_on_dfatal) {
    if (data_->first_fatal_) {
      // Store crash information so that it is accessible from within signal
      // handlers that may be invoked later.
      RecordCrashReason(&crash_reason);
      SetCrashReason(&crash_reason);

      // Store shortened fatal message for other logs and GWQ status
      const int copy = min<int>(data_->num_chars_to_log_,
                                sizeof(fatal_message)-1);
      memcpy(fatal_message, data_->message_text_, copy);
      fatal_message[copy] = '\0';
      fatal_time = data_->timestamp_;
    }

    if (!FLAGS_logtostderr) {
      for (int i = 0; i < NUM_SEVERITIES; ++i) {
        if ( LogDestination::log_destinations_[i] )
          LogDestination::log_destinations_[i]->logger_->Write(true, 0, "", 0);
      }
    }

    // release the lock that our caller (directly or indirectly)
    // LogMessage::~LogMessage() grabbed so that signal handlers
    // can use the logging facility. Alternately, we could add
    // an entire unsafe logging interface to bypass locking
    // for signal handlers but this seems simpler.
    log_mutex.Unlock();
    LogDestination::WaitForSinks(data_);

    const char* message = "*** Check failure stack trace: ***\n";
    if (write(STDERR_FILENO, message, strlen(message)) < 0) {
      // Ignore errors.
    }
    Fail();
  }
}